

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.h
# Opt level: O2

uint64 Hash128to64(uint128 *x)

{
  ulong uVar1;
  
  uVar1 = (x->first ^ x->second) * -0x622015f714c7d297;
  uVar1 = (uVar1 >> 0x2f ^ x->second ^ uVar1) * -0x622015f714c7d297;
  return (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
}

Assistant:

inline uint64 Hash128to64(const uint128& x) {
  // Murmur-inspired hashing.
  const uint64 kMul = 0x9ddfea08eb382d69ULL;
  uint64 a = (Uint128Low64(x) ^ Uint128High64(x)) * kMul;
  a ^= (a >> 47);
  uint64 b = (Uint128High64(x) ^ a) * kMul;
  b ^= (b >> 47);
  b *= kMul;
  return b;
}